

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O2

unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_> __thiscall
pstore::region::get_factory
          (region *this,shared_ptr<pstore::file::in_memory> *file,uint64_t full_size,
          uint64_t min_size)

{
  element_type *peVar1;
  shared_ptr<pstore::file::in_memory> local_28;
  uint64_t local_18;
  
  local_28.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)min_size;
  local_18 = full_size;
  std::
  make_unique<pstore::region::mem_based_factory,std::shared_ptr<pstore::file::in_memory>const&,unsigned_long&,unsigned_long&>
            (&local_28,(unsigned_long *)file,&local_18);
  peVar1 = local_28.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(element_type **)this = peVar1;
  std::
  unique_ptr<pstore::region::mem_based_factory,_std::default_delete<pstore::region::mem_based_factory>_>
  ::~unique_ptr((unique_ptr<pstore::region::mem_based_factory,_std::default_delete<pstore::region::mem_based_factory>_>
                 *)&local_28);
  return (__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
          )(__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<factory> get_factory (std::shared_ptr<file::in_memory> const & file,
                                              std::uint64_t full_size, std::uint64_t min_size) {
            return std::make_unique<mem_based_factory> (file, full_size, min_size);
        }